

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject.h
# Opt level: O1

void __thiscall
cinject::Container::findInstanceRetrievers
          (Container *this,
          vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>
          *instanceRetrievers,component_type *type)

{
  const_iterator cVar1;
  
  do {
    cVar1 = std::
            _Hashtable<cinject::component_type,_std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>,_std::allocator<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cinject::component_type>,_cinject::component_type_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->registrations_)._M_h,type);
    if (cVar1.
        super__Node_iterator_base<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      std::
      vector<std::shared_ptr<cinject::IInstanceRetriever>,std::allocator<std::shared_ptr<cinject::IInstanceRetriever>>>
      ::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<cinject::IInstanceRetriever>const*,std::vector<std::shared_ptr<cinject::IInstanceRetriever>,std::allocator<std::shared_ptr<cinject::IInstanceRetriever>>>>>
                ((vector<std::shared_ptr<cinject::IInstanceRetriever>,std::allocator<std::shared_ptr<cinject::IInstanceRetriever>>>
                  *)instanceRetrievers,
                 (instanceRetrievers->
                 super__Vector_base<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish,
                 *(undefined8 *)
                  ((long)cVar1.
                         super__Node_iterator_base<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>,_true>
                         ._M_cur + 0x30),
                 *(undefined8 *)
                  ((long)cVar1.
                         super__Node_iterator_base<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>,_true>
                         ._M_cur + 0x38));
    }
    this = this->parentContainer_;
  } while (this != (Container *)0x0);
  return;
}

Assistant:

inline void Container::findInstanceRetrievers(std::vector<std::shared_ptr<IInstanceRetriever>>& instanceRetrievers, const component_type& type) const
{
    auto iter = registrations_.find(type);
    if (iter != registrations_.end())
    {
        const std::vector<std::shared_ptr<IInstanceRetriever>>& currentRetrievers = iter->second;

        instanceRetrievers.insert(instanceRetrievers.end(), currentRetrievers.begin(), currentRetrievers.end());
    }

    if (parentContainer_ != nullptr)
    {
        parentContainer_->findInstanceRetrievers(instanceRetrievers, type);
    }
}